

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_clr_16_aw(void)

{
  uint uVar1;
  
  uVar1 = m68ki_read_imm_16();
  m68ki_write_16_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,0);
  m68ki_cpu.n_flag = 0;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.not_z_flag = 0;
  return;
}

Assistant:

static void m68k_op_clr_16_aw(void)
{
	m68ki_write_16(EA_AW_16(), 0);

	FLAG_N = NFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
	FLAG_Z = ZFLAG_SET;
}